

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Gia_Man_t * Au_NtkDeriveFlatGia(Au_Ntk_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Man_t *p_00;
  Au_Obj_t *pAVar3;
  Gia_Man_t *pGVar4;
  int local_2c;
  int i;
  Au_Obj_t *pTerm;
  Gia_Man_t *pGia;
  Gia_Man_t *pTemp;
  Au_Ntk_t *p_local;
  
  pcVar2 = Au_NtkName(p);
  printf("Collapsing model \"%s\"...\n",pcVar2);
  Au_NtkCleanCopy(p);
  p_00 = Gia_ManStart(0x10000);
  pcVar2 = Au_NtkName(p);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p_00->pName = pcVar2;
  Gia_ManHashAlloc(p_00);
  Gia_ManFlipVerbose(p_00);
  for (local_2c = 0; iVar1 = Vec_IntSize(&p->vPis), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Au_NtkPi(p,local_2c);
    iVar1 = Gia_ManAppendCi(p_00);
    Au_ObjSetCopy(pAVar3,iVar1);
  }
  Au_NtkDeriveFlatGia_rec(p_00,p);
  for (local_2c = 0; iVar1 = Vec_IntSize(&p->vPos), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Au_NtkPo(p,local_2c);
    iVar1 = Au_ObjCopy(pAVar3);
    Gia_ManAppendCo(p_00,iVar1);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar4 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Au_NtkDeriveFlatGia( Au_Ntk_t * p )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Au_Obj_t * pTerm;
    int i;
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    Au_NtkCleanCopy( p );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Au_NtkName(p) );
//    pGia->pSpec = Abc_UtilStrsav( Au_NtkSpec(p) );
    Gia_ManHashAlloc( pGia );
    Gia_ManFlipVerbose( pGia );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetCopy( pTerm, Gia_ManAppendCi(pGia) );
    // recursively flatten hierarchy
    Au_NtkDeriveFlatGia_rec( pGia, p );
    // create POs
    Au_NtkForEachPo( p, pTerm, i )
        Gia_ManAppendCo( pGia, Au_ObjCopy(pTerm) );
    // prepare return value
//    Gia_ManHashProfile( pGia );
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}